

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int spng_set_chrm(spng_ctx *ctx,spng_chrm *chrm)

{
  ulong uVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  spng_chrm_int chrm_int;
  spng_chrm_int local_38;
  
  if (chrm != (spng_chrm *)0x0 && ctx != (spng_ctx *)0x0) {
    if ((ctx->data == (uchar *)0x0) && ((ctx->field_0xcc & 0x10) == 0)) {
      iVar2 = 0x52;
    }
    else {
      iVar2 = read_chunks(ctx,0);
      if (iVar2 == 0) {
        dVar3 = chrm->white_point_x * 100000.0;
        dVar4 = chrm->white_point_y * 100000.0;
        dVar5 = chrm->red_x * 100000.0;
        dVar6 = chrm->red_y * 100000.0;
        iVar2 = (int)dVar5;
        iVar7 = (int)dVar6;
        local_38._8_8_ =
             CONCAT44((int)(dVar6 - 2147483648.0),(int)(dVar5 - 2147483648.0)) &
             CONCAT44(iVar7 >> 0x1f,iVar2 >> 0x1f) | CONCAT44(iVar7,iVar2);
        iVar2 = (int)dVar3;
        iVar7 = (int)dVar4;
        local_38._0_8_ =
             CONCAT44((int)(dVar4 - 2147483648.0),(int)(dVar3 - 2147483648.0)) &
             CONCAT44(iVar7 >> 0x1f,iVar2 >> 0x1f) | CONCAT44(iVar7,iVar2);
        dVar3 = chrm->green_x * 100000.0;
        dVar4 = chrm->green_y * 100000.0;
        dVar5 = chrm->blue_x * 100000.0;
        dVar6 = chrm->blue_y * 100000.0;
        iVar2 = (int)dVar5;
        iVar7 = (int)dVar6;
        local_38._24_8_ =
             CONCAT44((int)(dVar6 - 2147483648.0),(int)(dVar5 - 2147483648.0)) &
             CONCAT44(iVar7 >> 0x1f,iVar2 >> 0x1f) | CONCAT44(iVar7,iVar2);
        iVar2 = (int)dVar3;
        iVar7 = (int)dVar4;
        local_38._16_8_ =
             CONCAT44((int)(dVar4 - 2147483648.0),(int)(dVar3 - 2147483648.0)) &
             CONCAT44(iVar7 >> 0x1f,iVar2 >> 0x1f) | CONCAT44(iVar7,iVar2);
        iVar2 = check_chrm_int(&local_38);
        if (iVar2 == 0) {
          (ctx->chrm_int).green_x = local_38.green_x;
          (ctx->chrm_int).green_y = local_38.green_y;
          (ctx->chrm_int).blue_x = local_38.blue_x;
          (ctx->chrm_int).blue_y = local_38.blue_y;
          (ctx->chrm_int).white_point_x = local_38.white_point_x;
          (ctx->chrm_int).white_point_y = local_38.white_point_y;
          (ctx->chrm_int).red_x = local_38.red_x;
          (ctx->chrm_int).red_y = local_38.red_y;
          uVar1._0_4_ = ctx->user;
          uVar1._4_4_ = ctx->stored;
          ctx->user = (spng_chunk_bitfield)(int)(uVar1 | 0x400000004);
          ctx->stored = (spng_chunk_bitfield)(int)((uVar1 | 0x400000004) >> 0x20);
          iVar2 = 0;
        }
        else {
          iVar2 = 0x22;
        }
      }
    }
    return iVar2;
  }
  return 1;
}

Assistant:

int spng_set_chrm(spng_ctx *ctx, struct spng_chrm *chrm)
{
    SPNG_SET_CHUNK_BOILERPLATE(chrm);

    struct spng_chrm_int chrm_int;

    chrm_int.white_point_x = (uint32_t)(chrm->white_point_x * 100000.0);
    chrm_int.white_point_y = (uint32_t)(chrm->white_point_y * 100000.0);
    chrm_int.red_x = (uint32_t)(chrm->red_x * 100000.0);
    chrm_int.red_y = (uint32_t)(chrm->red_y * 100000.0);
    chrm_int.green_x = (uint32_t)(chrm->green_x * 100000.0);
    chrm_int.green_y = (uint32_t)(chrm->green_y * 100000.0);
    chrm_int.blue_x = (uint32_t)(chrm->blue_x * 100000.0);
    chrm_int.blue_y = (uint32_t)(chrm->blue_y * 100000.0);

    if(check_chrm_int(&chrm_int)) return SPNG_ECHRM;

    ctx->chrm_int = chrm_int;

    ctx->stored.chrm = 1;
    ctx->user.chrm = 1;

    return 0;
}